

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O2

void __thiscall
Equality_unitsEqualDifferingOrderOfUnitsManyUnit_Test::TestBody
          (Equality_unitsEqualDifferingOrderOfUnitsManyUnit_Test *this)

{
  element_type *peVar1;
  char cVar2;
  AssertionResult local_a0 [2];
  allocator<char> local_80 [14];
  allocator<char> local_72;
  allocator<char> local_71;
  AssertionResult gtest_ar_;
  allocator<char> local_50 [32];
  UnitsPtr u2;
  UnitsPtr u1;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"unitsA",(allocator<char> *)&gtest_ar_);
  libcellml::Units::create((string *)&u1);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"unitsA",(allocator<char> *)&gtest_ar_);
  libcellml::Units::create((string *)&u2);
  std::__cxx11::string::~string((string *)local_a0);
  peVar1 = u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a0,"second",local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar_,"unit_id",local_80);
  libcellml::Units::addUnit((string *)peVar1,1.0,(string *)local_a0);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::__cxx11::string::~string((string *)local_a0);
  peVar1 = u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a0,"metre",local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar_,"",local_80);
  libcellml::Units::addUnit((string *)peVar1,3.0,(string *)local_a0);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::__cxx11::string::~string((string *)local_a0);
  peVar1 = u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a0,"apple",local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar_,"",local_80);
  libcellml::Units::addUnit((string *)peVar1,1.0,(string *)local_a0);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::__cxx11::string::~string((string *)local_a0);
  peVar1 = u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a0,"jedi",local_80);
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar_,"yota",&local_71);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"",&local_72);
  libcellml::Units::addUnit((string *)peVar1,(string *)local_a0,-2.0,1.0,(string *)&gtest_ar_);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::__cxx11::string::~string((string *)local_a0);
  peVar1 = u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"flip",(allocator<char> *)&gtest_ar_);
  libcellml::Units::addUnit((string *)peVar1);
  std::__cxx11::string::~string((string *)local_a0);
  peVar1 = u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"lumen",(allocator<char> *)&gtest_ar_);
  libcellml::Units::addUnit((string *)peVar1);
  std::__cxx11::string::~string((string *)local_a0);
  peVar1 = u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a0,"jedi",local_80);
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar_,"yota",&local_71);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"",&local_72);
  libcellml::Units::addUnit((string *)peVar1,(string *)local_a0,-2.0,1.0,(string *)&gtest_ar_);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::__cxx11::string::~string((string *)local_a0);
  peVar1 = u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a0,"second",local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar_,"unit_id",local_80);
  libcellml::Units::addUnit((string *)peVar1,1.0,(string *)local_a0);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::__cxx11::string::~string((string *)local_a0);
  peVar1 = u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"lumen",(allocator<char> *)&gtest_ar_);
  libcellml::Units::addUnit((string *)peVar1);
  std::__cxx11::string::~string((string *)local_a0);
  peVar1 = u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a0,"metre",local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar_,"",local_80);
  libcellml::Units::addUnit((string *)peVar1,3.0,(string *)local_a0);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::__cxx11::string::~string((string *)local_a0);
  peVar1 = u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a0,"apple",local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar_,"",local_80);
  libcellml::Units::addUnit((string *)peVar1,1.0,(string *)local_a0);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::__cxx11::string::~string((string *)local_a0);
  peVar1 = u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"flip",(allocator<char> *)&gtest_ar_);
  libcellml::Units::addUnit((string *)peVar1);
  std::__cxx11::string::~string((string *)local_a0);
  std::__shared_ptr<libcellml::Entity,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Units,void>
            ((__shared_ptr<libcellml::Entity,(__gnu_cxx::_Lock_policy)2> *)local_a0,
             &u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>);
  gtest_ar_.success_ =
       (bool)libcellml::Entity::equals
                       ((shared_ptr *)
                        u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a0[0].message_);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_a0,&gtest_ar_.success_,"u1->equals(u2)","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x146,(char *)local_a0[0]._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    std::__cxx11::string::~string((string *)local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_ptr<libcellml::Entity,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Units,void>
            ((__shared_ptr<libcellml::Entity,(__gnu_cxx::_Lock_policy)2> *)local_a0,
             &u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>);
  cVar2 = libcellml::Entity::equals
                    ((shared_ptr *)
                     u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = (bool)cVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a0[0].message_);
  if (cVar2 == '\0') {
    testing::Message::Message((Message *)local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_a0,&gtest_ar_.success_,"u2->equals(u1)","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x147,(char *)local_a0[0]._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    std::__cxx11::string::~string((string *)local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Equality, unitsEqualDifferingOrderOfUnitsManyUnit)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsA");

    u1->addUnit("second", 1.0, "unit_id");
    u1->addUnit("metre", 3.0);
    u1->addUnit("apple", 1.0);
    u1->addUnit("jedi", "yota", -2.0);
    u1->addUnit("flip");
    u1->addUnit("lumen");

    u2->addUnit("jedi", "yota", -2.0);
    u2->addUnit("second", 1.0, "unit_id");
    u2->addUnit("lumen");
    u2->addUnit("metre", 3.0);
    u2->addUnit("apple", 1.0);
    u2->addUnit("flip");

    EXPECT_TRUE(u1->equals(u2));
    EXPECT_TRUE(u2->equals(u1));
}